

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

void Gli_ManGlitching(Gli_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  p->vAffected->nSize = 0;
  pVVar4 = p->vCisChanged;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    do {
      Vec_IntPush(p->vAffected,pVVar4->pArray[lVar10]);
      lVar10 = lVar10 + 1;
      pVVar4 = p->vCisChanged;
    } while (lVar10 < pVVar4->nSize);
    pVVar4 = p->vAffected;
    if (0 < pVVar4->nSize) {
      pVVar6 = p->vFrontier;
      do {
        pVVar6->nSize = 0;
        if (0 < pVVar4->nSize) {
          lVar10 = 0;
          do {
            if (p->pObjData == (int *)0x0) break;
            puVar1 = (uint *)(p->pObjData + pVVar4->pArray[lVar10]);
            uVar5 = *puVar1;
            if (0x7f < uVar5) {
              lVar9 = 0;
              do {
                lVar3 = (long)(int)puVar1[(ulong)(uVar5 >> 4 & 7) + lVar9 + 7];
                uVar8 = puVar1[lVar3];
                if ((char)((uVar8 & 8) >> 3) == '\0' && (uVar8 & 0x71) != 0x11) {
                  puVar1[lVar3] = uVar8 | 8;
                  Vec_IntPush(p->vFrontier,puVar1[lVar3 + 1]);
                  uVar5 = *puVar1;
                }
                lVar9 = lVar9 + 1;
              } while ((uint)lVar9 < uVar5 >> 7);
              pVVar4 = p->vAffected;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar4->nSize);
          pVVar6 = p->vFrontier;
        }
        pVVar4->nSize = 0;
        if (0 < pVVar6->nSize) {
          lVar10 = 0;
          do {
            if (p->pObjData == (int *)0x0) break;
            puVar1 = (uint *)(p->pObjData + pVVar6->pArray[lVar10]);
            uVar5 = *puVar1;
            *puVar1 = uVar5 & 0xfffffff7;
            uVar8 = uVar5 >> 4 & 7;
            if (uVar8 == 0) {
              uVar2 = 0;
            }
            else {
              uVar7 = 0;
              uVar2 = 0;
              do {
                uVar2 = uVar2 | (puVar1[-(long)(int)puVar1[uVar7 + 7]] >> 2 & 1) <<
                                ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
            if (((puVar1[(long)((int)uVar2 >> 5) + 2] >> ((byte)uVar2 & 0x1f) ^ uVar5 >> 2) & 1) !=
                0) {
              *puVar1 = uVar5 & 0xfffffff7 ^ 4;
              puVar1[6] = puVar1[6] + 1;
              Vec_IntPush(p->vAffected,puVar1[1]);
            }
            lVar10 = lVar10 + 1;
            pVVar6 = p->vFrontier;
          } while (lVar10 < pVVar6->nSize);
          pVVar4 = p->vAffected;
        }
      } while (0 < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Gli_ManGlitching( Gli_Man_t * p )
{
    Gli_Obj_t * pThis, * pFanout;//, * pOther = Gli_ManObj(p, 41);
    int i, k, Handle;
//    Gli_ManForEachObj( p, pThis, i )
//        assert( pThis->fMark == 0 );
    // start the array of affected nodes
    Vec_IntClear( p->vAffected );
    Vec_IntForEachEntry( p->vCisChanged, Handle, i )
        Vec_IntPush( p->vAffected, Handle );
    // iteration propagation
    while ( Vec_IntSize(p->vAffected) > 0 )
    {
        // compute the frontier
        Vec_IntClear( p->vFrontier );
        Gli_ManForEachEntry( p->vAffected, p, pThis, i )
        {
            Gli_ObjForEachFanout( pThis, pFanout, k )
            {
                if ( Gli_ObjIsCo(pFanout) )
                    continue;
                if ( pFanout->fMark )
                    continue;
                pFanout->fMark = 1;
                Vec_IntPush( p->vFrontier, pFanout->Handle );
            }
        }
        // compute the next set of affected nodes
        Vec_IntClear( p->vAffected );
        Gli_ManForEachEntry( p->vFrontier, p, pThis, i )
        {
            pThis->fMark = 0;
            if ( ((int)pThis->fPhase2) == Gli_NodeComputeValue2(pThis) )
                continue;
            pThis->fPhase2 ^= 1;
            pThis->nGlitches++;
            Vec_IntPush( p->vAffected, pThis->Handle );
        }
    }
}